

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Shared_Image.cxx
# Opt level: O2

Fl_Shared_Image * Fl_Shared_Image::find(char *name,int W,int H)

{
  int *piVar1;
  Fl_Shared_Image *pFVar2;
  size_t sVar3;
  char *__dest;
  long *plVar4;
  Fl_Shared_Image *key;
  
  if (num_images_ != 0) {
    pFVar2 = (Fl_Shared_Image *)operator_new(0x48);
    Fl_Shared_Image(pFVar2);
    key = pFVar2;
    sVar3 = strlen(name);
    __dest = (char *)operator_new__(sVar3 + 1);
    pFVar2->name_ = __dest;
    strcpy(__dest,name);
    (pFVar2->super_Fl_Image).w_ = W;
    (pFVar2->super_Fl_Image).h_ = H;
    plVar4 = (long *)bsearch(&key,images_,(long)num_images_,8,compare);
    if (key != (Fl_Shared_Image *)0x0) {
      (*(key->super_Fl_Image)._vptr_Fl_Image[1])();
    }
    if (plVar4 != (long *)0x0) {
      pFVar2 = (Fl_Shared_Image *)*plVar4;
      piVar1 = &pFVar2->refcount_;
      *piVar1 = *piVar1 + 1;
      return pFVar2;
    }
  }
  return (Fl_Shared_Image *)0x0;
}

Assistant:

Fl_Shared_Image* Fl_Shared_Image::find(const char *name, int W, int H) {
  Fl_Shared_Image	*key,		// Image key
			**match;	// Matching image

  if (num_images_) {
    key = new Fl_Shared_Image();
    key->name_ = new char[strlen(name) + 1];
    strcpy((char *)key->name_, name);
    key->w(W);
    key->h(H);

    match = (Fl_Shared_Image **)bsearch(&key, images_, num_images_,
                                        sizeof(Fl_Shared_Image *),
                                        (compare_func_t)compare);

    delete key;

    if (match) {
      (*match)->refcount_ ++;
      return *match;
    }
  }

  return 0;
}